

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void cf_hash_drbg_sha256_gen_additional
               (cf_hash_drbg_sha256 *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  uint8_t *local_48;
  size_t take;
  uint8_t *bout;
  size_t nout_local;
  void *out_local;
  size_t naddnl_local;
  void *addnl_local;
  cf_hash_drbg_sha256 *ctx_local;
  
  take = (size_t)out;
  out_local = (void *)naddnl;
  naddnl_local = (size_t)addnl;
  for (bout = (uint8_t *)nout; bout != (uint8_t *)0x0; bout = bout + -(long)local_48) {
    if (bout < (uint8_t *)0x10001) {
      local_48 = bout;
    }
    else {
      local_48 = (uint8_t *)0x10000;
    }
    hash_gen_request(ctx,(void *)naddnl_local,(size_t)out_local,(void *)take,(size_t)local_48);
    take = (size_t)(local_48 + take);
    naddnl_local = 0;
    out_local = (void *)0x0;
  }
  return;
}

Assistant:

void cf_hash_drbg_sha256_gen_additional(cf_hash_drbg_sha256 *ctx,
                                        const void *addnl, size_t naddnl,
                                        void *out, size_t nout)
{
  uint8_t *bout = out;

  /* Generate output in requests of MAX_DRBG_GENERATE in size. */
  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hash_gen_request(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}